

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

void __thiscall
capnp::_::(anonymous_namespace)::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl((MembranePolicyImpl *)(this + -8));
  return;
}

Assistant:

MembranePolicyImpl() = default;